

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

int __thiscall
QAbstractSocketPrivate::bind(QAbstractSocketPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  byte bVar2;
  quint16 qVar3;
  NetworkLayerProtocol NVar4;
  Int IVar5;
  SocketError SVar6;
  ulong uVar7;
  qintptr qVar8;
  undefined4 in_register_00000034;
  undefined8 uVar9;
  long in_FS_OFFSET;
  bool result;
  NetworkLayerProtocol protocol;
  QAbstractSocket *q;
  QHostAddress nullAddress;
  undefined4 in_stack_ffffffffffffff48;
  BindFlag in_stack_ffffffffffffff4c;
  BindFlag in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QAbstractSocket::BindFlag> in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  NetworkLayerProtocol in_stack_ffffffffffffff6c;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff70;
  QAbstractSocketPrivate *hostname;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QFlagsStorageHelper<QAbstractSocket::BindFlag,_4> local_3c;
  QFlagsStorageHelper<QAbstractSocket::BindFlag,_4> local_38;
  socklen_t local_34;
  undefined8 local_18;
  socklen_t local_c;
  long local_8;
  
  uVar9 = CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  hostname = this;
  local_c = __len;
  q_func(this);
  if ((this->socketEngine == (QAbstractSocketEngine *)0x0) ||
     (uVar7 = (**(code **)(*(long *)this->socketEngine + 0x78))(), (uVar7 & 1) == 0)) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress
              ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QHostAddress::toString
              ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    resolveProxy((QAbstractSocketPrivate *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),(QString *)hostname,
                 (quint16)((ulong)uVar9 >> 0x30));
    QString::~QString((QString *)0x251d9a);
    NVar4 = QHostAddress::protocol((QHostAddress *)0x251da4);
    if (NVar4 == UnknownNetworkLayerProtocol) {
      NVar4 = QHostAddress::protocol((QHostAddress *)0x251dbc);
    }
    bVar1 = initSocketLayer((QAbstractSocketPrivate *)CONCAT44(NVar4,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c);
    if (!bVar1) {
      in_stack_ffffffffffffff9f = 0;
    }
    uVar10 = (uint)!bVar1;
    QHostAddress::~QHostAddress((QHostAddress *)0x251df6);
    if (uVar10 != 0) goto LAB_00252026;
  }
  local_34 = local_c;
  bVar1 = ::operator!=((QFlags<QAbstractSocket::BindFlag>)in_stack_ffffffffffffff5c.i,
                       in_stack_ffffffffffffff50);
  if (bVar1) {
    local_38.super_QFlagsStorage<QAbstractSocket::BindFlag>.i =
         (QFlagsStorage<QAbstractSocket::BindFlag>)
         QFlags<QAbstractSocket::BindFlag>::operator&
                   ((QFlags<QAbstractSocket::BindFlag> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
    in_stack_ffffffffffffff5c.i = CONCAT13(1,(int3)in_stack_ffffffffffffff5c.i);
    if (IVar5 == 0) {
      local_3c.super_QFlagsStorage<QAbstractSocket::BindFlag>.i =
           (QFlagsStorage<QAbstractSocket::BindFlag>)
           QFlags<QAbstractSocket::BindFlag>::operator&
                     ((QFlags<QAbstractSocket::BindFlag> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff4c);
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
      in_stack_ffffffffffffff5c.i = CONCAT13(IVar5 != 0,(int3)in_stack_ffffffffffffff5c.i);
    }
    if ((char)(in_stack_ffffffffffffff5c.i >> 0x18) == '\0') {
      (**(code **)(*(long *)this->socketEngine + 0x118))(this->socketEngine,4,0);
    }
    else {
      (**(code **)(*(long *)this->socketEngine + 0x118))(this->socketEngine,4,1);
    }
  }
  bVar2 = (**(code **)(*(long *)this->socketEngine + 0x90))
                    (this->socketEngine,uVar9,(ulong)__addr & 0xffff);
  uVar10 = (bVar2 & 1) << 0x18;
  qVar8 = (**(code **)(*(long *)this->socketEngine + 0x70))();
  this->cachedSocketDescriptor = qVar8;
  if ((uVar10 & 0x1000000) == 0) {
    SVar6 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x251f36);
    QAbstractSocketEngine::errorString
              ((QAbstractSocketEngine *)CONCAT44(in_stack_ffffffffffffff5c.i,SVar6));
    setErrorAndEmit(this,in_stack_ffffffffffffff5c.i,
                    (QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QString::~QString((QString *)0x251f6f);
    in_stack_ffffffffffffff9f = 0;
  }
  else {
    this->state = BoundState;
    QAbstractSocketEngine::localAddress
              ((QAbstractSocketEngine *)
               CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
    QHostAddress::operator=
              ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (QHostAddress *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QHostAddress::~QHostAddress((QHostAddress *)0x251fb9);
    qVar3 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)0x251fca);
    this->localPort = qVar3;
    QAbstractSocket::stateChanged((QAbstractSocket *)0x251fe9,in_stack_ffffffffffffff4c);
    bVar1 = QAbstractSocket::isValid
                      ((QAbstractSocket *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if ((bVar1) && (this->socketType == UdpSocket)) {
      (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,1);
    }
    in_stack_ffffffffffffff9f = 1;
  }
LAB_00252026:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),in_stack_ffffffffffffff9f
                       ) & 0xffffff01;
}

Assistant:

bool QAbstractSocketPrivate::bind(const QHostAddress &address, quint16 port, QAbstractSocket::BindMode mode)
{
    Q_Q(QAbstractSocket);

    // now check if the socket engine is initialized and to the right type
    if (!socketEngine || !socketEngine->isValid()) {
        QHostAddress nullAddress;
        resolveProxy(nullAddress.toString(), port);

        QAbstractSocket::NetworkLayerProtocol protocol = address.protocol();
        if (protocol == QAbstractSocket::UnknownNetworkLayerProtocol)
            protocol = nullAddress.protocol();

        if (!initSocketLayer(protocol))
            return false;
    }

    if (mode != QAbstractSocket::DefaultForPlatform) {
#ifdef Q_OS_UNIX
    if ((mode & QAbstractSocket::ShareAddress) || (mode & QAbstractSocket::ReuseAddressHint))
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
#endif
#ifdef Q_OS_WIN
    if (mode & QAbstractSocket::ReuseAddressHint)
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
    if (mode & QAbstractSocket::DontShareAddress)
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 0);
#endif
    }
    bool result = socketEngine->bind(address, port);
    cachedSocketDescriptor = socketEngine->socketDescriptor();

    if (!result) {
        setErrorAndEmit(socketEngine->error(), socketEngine->errorString());
        return false;
    }

    state = QAbstractSocket::BoundState;
    localAddress = socketEngine->localAddress();
    localPort = socketEngine->localPort();

    emit q->stateChanged(state);
    // A slot attached to stateChanged() signal can break our invariant:
    // by closing the socket it will reset its socket engine - thus we
    // have additional check (isValid()) ...
    if (q->isValid() && socketType == QAbstractSocket::UdpSocket)
        socketEngine->setReadNotificationEnabled(true);
    return true;
}